

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyImplPrivate::completeCacheSave(QNetworkReplyImplPrivate *this)

{
  QAbstractNetworkCache *pQVar1;
  
  if ((this->cacheEnabled == true) && ((this->super_QNetworkReplyPrivate).errorCode != NoError)) {
    pQVar1 = networkCache(this);
    (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&(this->super_QNetworkReplyPrivate).url);
  }
  else if ((this->cacheEnabled != false) && (this->cacheSaveDevice != (QIODevice *)0x0)) {
    pQVar1 = networkCache(this);
    (**(code **)(*(long *)pQVar1 + 0x90))(pQVar1,this->cacheSaveDevice);
  }
  this->cacheSaveDevice = (QIODevice *)0x0;
  this->cacheEnabled = false;
  return;
}

Assistant:

void QNetworkReplyImplPrivate::completeCacheSave()
{
    if (cacheEnabled && errorCode != QNetworkReplyImpl::NoError) {
        networkCache()->remove(url);
    } else if (cacheEnabled && cacheSaveDevice) {
        networkCache()->insert(cacheSaveDevice);
    }
    cacheSaveDevice = nullptr;
    cacheEnabled = false;
}